

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<kj::CappedArray<char,17ul>,char_const(&)[3]>
          (String *__return_storage_ptr__,kj *this,CappedArray<char,_17UL> *params,
          char (*params_1) [3])

{
  CappedArray<char,_17UL> *value;
  char (*value_00) [3];
  ArrayPtr<const_char> local_40;
  ArrayPtr<const_char> local_30;
  CappedArray<char,_17UL> *local_20;
  char (*params_local_1) [3];
  CappedArray<char,_17UL> *params_local;
  
  local_20 = params;
  params_local_1 = (char (*) [3])this;
  params_local = (CappedArray<char,_17UL> *)__return_storage_ptr__;
  value = fwd<kj::CappedArray<char,17ul>>((NoInfer<kj::CappedArray<char,_17UL>_> *)this);
  local_30 = toCharSequence<kj::CappedArray<char,17ul>>(value);
  value_00 = ::const((char (*) [3])local_20);
  local_40 = toCharSequence<char_const(&)[3]>(value_00);
  _::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_30,&local_40,(ArrayPtr<const_char> *)params_1);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}